

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

string * __thiscall
pbrt::FormattingScene::upgradeMaterialIndex
          (string *__return_storage_ptr__,FormattingScene *this,string *name,
          ParameterDictionary *dict,FileLoc loc)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  int iVar6;
  undefined8 *puVar7;
  undefined1 *puVar8;
  pointer pcVar9;
  undefined8 uVar10;
  string ret;
  Float value;
  vector<float,_std::allocator<float>_> index;
  string tex;
  string local_b0;
  string local_90;
  float local_6c;
  vector<float,_std::allocator<float>_> local_68;
  string local_50;
  
  iVar6 = std::__cxx11::string::compare((char *)name);
  if ((iVar6 != 0) && (iVar6 = std::__cxx11::string::compare((char *)name), iVar6 != 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    return __return_storage_ptr__;
  }
  paVar2 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"index","");
  ParameterDictionary::GetTexture(&local_50,dict,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1));
  }
  if (local_50._M_string_length == 0) {
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"index","");
    ParameterDictionary::GetFloatArray(&local_68,dict,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1))
      ;
    }
    if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    else if ((long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start == 4) {
      local_b0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"eta","");
      ParameterDictionary::GetFloatArray
                ((vector<float,_std::allocator<float>_> *)&local_90,dict,&local_b0);
      sVar4 = local_90._M_string_length;
      _Var5._M_p = local_90._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) - (long)local_90._M_dataplus._M_p
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        (ulong)(local_b0.field_2._M_allocated_capacity + 1));
      }
      if (_Var5._M_p == (pointer)sVar4) {
        paVar2 = &local_b0.field_2;
        local_6c = *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_b0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"index","");
        ParameterDictionary::RemoveFloat(dict,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          (ulong)(local_b0.field_2._M_allocated_capacity + 1));
        }
        local_b0._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct
                  ((ulong)&local_b0,
                   (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
        paVar3 = &local_90.field_2;
        local_90._M_string_length = 0;
        local_90.field_2._M_local_buf[0] = '\0';
        local_90._M_dataplus._M_p = (pointer)paVar3;
        detail::stringPrintfRecursive<float&>(&local_90,"\"float eta\" [ %f ]\n",&local_6c);
        uVar10 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar2) {
          uVar10 = local_b0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < (pointer)(local_90._M_string_length + local_b0._M_string_length)) {
          pcVar9 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != paVar3) {
            pcVar9 = (pointer)CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                       local_90.field_2._M_local_buf[0]);
          }
          if (pcVar9 < (pointer)(local_90._M_string_length + local_b0._M_string_length))
          goto LAB_00560803;
          puVar7 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
        }
        else {
LAB_00560803:
          puVar7 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
        }
        psVar1 = puVar7 + 2;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if ((size_type *)*puVar7 == psVar1) {
          uVar10 = puVar7[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
        }
        __return_storage_ptr__->_M_string_length = puVar7[1];
        *puVar7 = psVar1;
        puVar7[1] = 0;
        *(undefined1 *)psVar1 = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar3) {
          operator_delete(local_90._M_dataplus._M_p,
                          CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar2) {
          operator_delete(local_b0._M_dataplus._M_p,
                          (ulong)(local_b0.field_2._M_allocated_capacity + 1));
        }
      }
      else {
        SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                  (&this->super_SceneRepresentation,&loc,
                   "Material \"%s\" has both \"index\" and \"eta\" parameters.",name);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      }
    }
    else {
      (this->super_SceneRepresentation).errorExit = true;
      Error(&loc,"Multiple values provided for \"index\" parameter.");
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_005606fb;
    puVar8 = (undefined1 *)
             ((long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage -
             (long)local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
  }
  else {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"eta","");
    ParameterDictionary::GetTexture(&local_b0,dict,&local_90);
    sVar4 = local_b0._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if (sVar4 != 0) {
      SceneRepresentation::ErrorExitDeferred<std::__cxx11::string_const&>
                (&this->super_SceneRepresentation,&loc,
                 "Material \"%s\" has both \"index\" and \"eta\" parameters.",name);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_005606fb;
    }
    paVar2 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"index","");
    ParameterDictionary::RemoveTexture(dict,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,(ulong)(local_b0.field_2._M_allocated_capacity + 1))
      ;
    }
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct
              ((ulong)&local_b0,
               (char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc + '\x04');
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    detail::stringPrintfRecursive<std::__cxx11::string&>
              (&local_90,"\"texture eta\" \"%s\"\n",&local_50);
    uVar10 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      uVar10 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < (pointer)(local_90._M_string_length + local_b0._M_string_length)) {
      pcVar9 = (pointer)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        pcVar9 = (pointer)CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                   local_90.field_2._M_local_buf[0]);
      }
      if (pcVar9 < (pointer)(local_90._M_string_length + local_b0._M_string_length))
      goto LAB_0056060b;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_90,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
    }
    else {
LAB_0056060b:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90._M_dataplus._M_p);
    }
    psVar1 = puVar7 + 2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((size_type *)*puVar7 == psVar1) {
      uVar10 = puVar7[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar10;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar7;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    __return_storage_ptr__->_M_string_length = puVar7[1];
    *puVar7 = psVar1;
    puVar7[1] = 0;
    *(undefined1 *)psVar1 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == paVar2) goto LAB_005606fb;
    puVar8 = (undefined1 *)(local_b0.field_2._M_allocated_capacity + 1);
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_b0._M_dataplus._M_p;
  }
  operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start,(ulong)puVar8);
LAB_005606fb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FormattingScene::upgradeMaterialIndex(const std::string &name,
                                                  ParameterDictionary *dict,
                                                  FileLoc loc) const {
    if (name != "glass" && name != "uber")
        return "";

    std::string tex = dict->GetTexture("index");
    if (!tex.empty()) {
        if (!dict->GetTexture("eta").empty()) {
            ErrorExitDeferred(
                &loc, R"(Material "%s" has both "index" and "eta" parameters.)", name);
            return "";
        }

        dict->RemoveTexture("index");
        return indent(1) + StringPrintf("\"texture eta\" \"%s\"\n", tex);
    } else {
        auto index = dict->GetFloatArray("index");
        if (index.empty())
            return "";
        if (index.size() != 1) {
            ErrorExitDeferred(&loc, "Multiple values provided for \"index\" parameter.");
            return "";
        }
        if (!dict->GetFloatArray("eta").empty()) {
            ErrorExitDeferred(
                &loc, R"(Material "%s" has both "index" and "eta" parameters.)", name);
            return "";
        }

        Float value = index[0];
        dict->RemoveFloat("index");
        return indent(1) + StringPrintf("\"float eta\" [ %f ]\n", value);
    }
}